

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessShaderDeclaration
          (ConversionStream *this,iterator EntryPointToken,SHADER_TYPE ShaderType)

{
  bool bVar1;
  bool bVar2;
  pointer pHVar3;
  ostream *poVar4;
  pointer pSVar5;
  char *pcVar6;
  char (*in_R8) [21];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  String local_5c0;
  undefined1 local_5a0 [8];
  string err_3;
  __normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
  local_578;
  __normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
  local_570;
  iterator OutStreamParamIt;
  iterator BodyEndToken;
  allocator local_551;
  string local_550;
  allocator local_529;
  string local_528;
  HLSLTokenInfo local_508;
  const_iterator local_4b8;
  String local_4b0;
  undefined1 local_490 [8];
  string err_2;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_468;
  iterator FirstStatementToken;
  undefined1 local_440 [8];
  string err_1;
  _Self local_418;
  _Self local_410;
  iterator BodyStartToken;
  allocator local_3f9;
  string local_3f8;
  allocator local_3d1;
  string local_3d0 [32];
  string local_3b0;
  HLSLTokenInfo local_390;
  const_iterator local_340;
  _List_node_base *local_338;
  allocator local_329;
  string local_328;
  allocator local_301;
  string local_300;
  HLSLTokenInfo local_2e0;
  const_iterator local_290 [2];
  runtime_error *anon_var_0;
  String Prologue;
  String GlobalVariables;
  Char *ReturnMacroName;
  stringstream ReturnHandlerSS;
  ostream local_228 [383];
  bool local_a9;
  iterator iStack_a8;
  bool bIsVoid;
  iterator ArgsListEndToken;
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  ShaderParams;
  String local_78;
  undefined1 local_58 [8];
  string err;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_30;
  iterator TypeToken;
  char *EntryPoint;
  SHADER_TYPE ShaderType_local;
  ConversionStream *this_local;
  iterator EntryPointToken_local;
  
  this_local = (ConversionStream *)EntryPointToken._M_node;
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
            ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&this_local);
  TypeToken._M_node = (_List_node_base *)std::__cxx11::string::c_str();
  local_30._M_node = (_List_node_base *)this_local;
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator--(&local_30);
  err.field_2._8_8_ =
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       begin(&this->m_Tokens);
  bVar1 = std::operator!=(&local_30,(_Self *)((long)&err.field_2 + 8));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                       ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&this_local);
    FormatString<char[11],std::__cxx11::string,char[21]>
              ((string *)local_58,(Diligent *)"Function \"",(char (*) [11])&pHVar3->Literal,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "\" misses return type",in_R8);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_78,this,&local_30,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessShaderDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x1027,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
               ,(char (*) [2])0xe6c869,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)local_58);
  }
  std::
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  ::vector((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
            *)&ArgsListEndToken);
  iStack_a8._M_node = local_30._M_node;
  local_a9 = false;
  ProcessFunctionParameters
            (this,&stack0xffffffffffffff58,
             (vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
              *)&ArgsListEndToken,&local_a9);
  pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                     ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&this_local);
  std::__cxx11::string::operator=((string *)&pHVar3->Literal,"main");
  std::__cxx11::stringstream::stringstream((stringstream *)&ReturnMacroName);
  poVar4 = std::operator<<(local_228,"#define ");
  poVar4 = std::operator<<(poVar4,"_RETURN_");
  pcVar6 = "(_RET_VAL_)";
  if ((local_a9 & 1U) != 0) {
    pcVar6 = "";
  }
  poVar4 = std::operator<<(poVar4,pcVar6);
  std::operator<<(poVar4," {\\\n");
  std::__cxx11::string::string((string *)(Prologue.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&anon_var_0);
  if (ShaderType == SHADER_TYPE_PIXEL) {
    ProcessFragmentShaderArguments
              (this,&local_30,
               (vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                *)&ArgsListEndToken,(String *)((long)&Prologue.field_2 + 8),
               (stringstream *)&ReturnMacroName,(String *)&anon_var_0);
  }
  else if (ShaderType == SHADER_TYPE_VERTEX) {
    ProcessVertexShaderArguments
              (this,(vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                     *)&ArgsListEndToken,(String *)((long)&Prologue.field_2 + 8),
               (stringstream *)&ReturnMacroName,(String *)&anon_var_0);
  }
  else if (ShaderType == SHADER_TYPE_GEOMETRY) {
    ProcessGeometryShaderArguments
              (this,&local_30,
               (vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                *)&ArgsListEndToken,(String *)((long)&Prologue.field_2 + 8),(String *)&anon_var_0);
  }
  else if (ShaderType == SHADER_TYPE_HULL) {
    ProcessHullShaderArguments
              (this,&local_30,
               (vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                *)&ArgsListEndToken,(String *)((long)&Prologue.field_2 + 8),
               (stringstream *)&ReturnMacroName,(String *)&anon_var_0);
  }
  else if (ShaderType == SHADER_TYPE_DOMAIN) {
    ProcessDomainShaderArguments
              (this,&local_30,
               (vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                *)&ArgsListEndToken,(String *)((long)&Prologue.field_2 + 8),
               (stringstream *)&ReturnMacroName,(String *)&anon_var_0);
  }
  else if (ShaderType == SHADER_TYPE_COMPUTE) {
    ProcessComputeShaderArguments
              (this,&local_30,
               (vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                *)&ArgsListEndToken,(String *)((long)&Prologue.field_2 + 8),(String *)&anon_var_0);
  }
  std::operator<<(local_228,"return;}\n");
  std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
            (local_290,&local_30);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_300,pcVar6,&local_301);
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_30);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_328,pcVar6,&local_329);
  Parsing::HLSLTokenInfo::HLSLTokenInfo
            (&local_2e0,TextBlock,&local_300,&local_328,0xffffffffffffffff);
  local_338 = (_List_node_base *)
              std::__cxx11::
              list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
              ::insert(&this->m_Tokens,local_290[0],&local_2e0);
  Parsing::HLSLTokenInfo::~HLSLTokenInfo(&local_2e0);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
            (&local_340,&local_30);
  std::__cxx11::stringstream::str();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3b0,pcVar6,&local_3d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3f8,"\n",&local_3f9);
  Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff;
  Parsing::HLSLTokenInfo::HLSLTokenInfo
            (&local_390,TextBlock,&local_3b0,&local_3f8,0xffffffffffffffff);
  BodyStartToken =
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       insert(&this->m_Tokens,local_340,&local_390);
  Parsing::HLSLTokenInfo::~HLSLTokenInfo(&local_390);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  std::__cxx11::string::~string(local_3d0);
  pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_30);
  std::__cxx11::string::operator=((string *)&pHVar3->Delimiter,"\n");
  local_410._M_node = iStack_a8._M_node;
  while( true ) {
    local_418._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
         end(&this->m_Tokens);
    bVar2 = std::operator!=(&local_410,&local_418);
    bVar1 = false;
    if (bVar2) {
      pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_410);
      bVar1 = pHVar3->Type != OpenBrace;
    }
    if (!bVar1) break;
    std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(&local_410);
  }
  err_1.field_2._8_8_ =
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       end(&this->m_Tokens);
  bVar1 = std::operator!=(&local_410,(_Self *)((long)&err_1.field_2 + 8));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    FormatString<char[74],char_const*,char[3]>
              ((string *)local_440,
               (Diligent *)
               "Unexpected end of file while looking for the body of shader entry point \"",
               (char (*) [74])&TypeToken,(char **)0xe7d923,(char (*) [3])Args);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              ((String *)&FirstStatementToken,this,&local_410,4);
    Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_440;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessShaderDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x1069,Args,(char (*) [2])0xe6c869,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &FirstStatementToken);
    std::__cxx11::string::~string((string *)&FirstStatementToken);
    std::__cxx11::string::~string((string *)local_440);
  }
  local_468._M_node = local_410._M_node;
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(&local_468);
  err_2.field_2._8_8_ =
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       end(&this->m_Tokens);
  bVar1 = std::operator!=(&local_468,(_Self *)((long)&err_2.field_2 + 8));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    FormatString<char[74],char_const*,char[3]>
              ((string *)local_490,
               (Diligent *)
               "Unexpected end of file while looking for the body of shader entry point \"",
               (char (*) [74])&TypeToken,(char **)0xe7d923,(char (*) [3])Args);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_4b0,this,&local_468,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessShaderDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x1070,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_490,(char (*) [2])0xe6c869,&local_4b0);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::__cxx11::string::~string((string *)local_490);
  }
  std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
            (&local_4b8,&local_468);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_528,pcVar6,&local_529);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_550,"\n",&local_551);
  Parsing::HLSLTokenInfo::HLSLTokenInfo
            (&local_508,TextBlock,&local_528,&local_550,0xffffffffffffffff);
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::insert
            (&this->m_Tokens,local_4b8,&local_508);
  Parsing::HLSLTokenInfo::~HLSLTokenInfo(&local_508);
  std::__cxx11::string::~string((string *)&local_550);
  std::allocator<char>::~allocator((allocator<char> *)&local_551);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator((allocator<char> *)&local_529);
  OutStreamParamIt._M_current = (ShaderParameterInfo *)local_410._M_node;
  if ((((ShaderType == SHADER_TYPE_VERTEX) || (ShaderType == SHADER_TYPE_HULL)) ||
      (ShaderType == SHADER_TYPE_DOMAIN)) || (ShaderType == SHADER_TYPE_PIXEL)) {
    ProcessReturnStatements
              (this,(iterator *)&OutStreamParamIt,(bool)(local_a9 & 1),(Char *)TypeToken._M_node,
               "_RETURN_");
  }
  else if (ShaderType == SHADER_TYPE_GEOMETRY) {
    local_570._M_current =
         (ShaderParameterInfo *)
         std::
         vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
         ::begin((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                  *)&ArgsListEndToken);
    while( true ) {
      local_578._M_current =
           (ShaderParameterInfo *)
           std::
           vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
           ::end((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                  *)&ArgsListEndToken);
      bVar1 = __gnu_cxx::operator!=(&local_570,&local_578);
      if ((!bVar1) ||
         (pSVar5 = __gnu_cxx::
                   __normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                   ::operator->(&local_570), (pSVar5->GSAttribs).Stream != Undefined)) break;
      __gnu_cxx::
      __normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
      ::operator++(&local_570);
    }
    err_3.field_2._8_8_ =
         std::
         vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
         ::end((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                *)&ArgsListEndToken);
    bVar1 = __gnu_cxx::operator!=
                      (&local_570,
                       (__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                        *)((long)&err_3.field_2 + 8));
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      FormatString<char[38]>
                ((string *)local_5a0,(char (*) [38])"Unable to find output stream variable");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_5c0,this,&local_468,4);
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessShaderDeclaration",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x1080,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_5a0,(char (*) [2])0xe6c869,&local_5c0);
      std::__cxx11::string::~string((string *)&local_5c0);
      std::__cxx11::string::~string((string *)local_5a0);
    }
    pSVar5 = __gnu_cxx::
             __normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
             ::operator->(&local_570);
    ProcessGSOutStreamOperations
              (this,(iterator *)&OutStreamParamIt,&pSVar5->Name,(char *)TypeToken._M_node);
  }
  std::__cxx11::string::~string((string *)&anon_var_0);
  std::__cxx11::string::~string((string *)(Prologue.field_2._M_local_buf + 8));
  std::__cxx11::stringstream::~stringstream((stringstream *)&ReturnMacroName);
  std::
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  ::~vector((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
             *)&ArgsListEndToken);
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessShaderDeclaration(TokenListType::iterator EntryPointToken, SHADER_TYPE ShaderType)
{
    const auto* EntryPoint = EntryPointToken->Literal.c_str();

    auto TypeToken = EntryPointToken;
    --TypeToken;
    // void TestPS  ( in VSOutput In,
    // ^
    // TypeToken
    VERIFY_PARSER_STATE(TypeToken, TypeToken != m_Tokens.begin(), "Function \"", EntryPointToken->Literal, "\" misses return type");

    std::vector<ShaderParameterInfo> ShaderParams;

    auto ArgsListEndToken = TypeToken;
    bool bIsVoid          = false;
    ProcessFunctionParameters(ArgsListEndToken, ShaderParams, bIsVoid);

    EntryPointToken->Literal = "main";
    //void main ()

    std::stringstream ReturnHandlerSS;
    const Char*       ReturnMacroName = "_RETURN_";
    // Some GLES compilers cannot properly handle macros with empty argument lists, such as _RETURN_().
    // Also, some compilers generate an error if there is no whitespace after the macro without arguments: _RETURN_{
    ReturnHandlerSS << "#define " << ReturnMacroName << (bIsVoid ? "" : "(_RET_VAL_)") << " {\\\n";

    String GlobalVariables, Prologue;
    try
    {
        if (ShaderType == SHADER_TYPE_PIXEL)
        {
            ProcessFragmentShaderArguments(TypeToken, ShaderParams, GlobalVariables, ReturnHandlerSS, Prologue);
        }
        else if (ShaderType == SHADER_TYPE_VERTEX)
        {
            ProcessVertexShaderArguments(ShaderParams, GlobalVariables, ReturnHandlerSS, Prologue);
        }
        else if (ShaderType == SHADER_TYPE_GEOMETRY)
        {
            ProcessGeometryShaderArguments(TypeToken, ShaderParams, GlobalVariables, Prologue);
        }
        else if (ShaderType == SHADER_TYPE_HULL)
        {
            ProcessHullShaderArguments(TypeToken, ShaderParams, GlobalVariables, ReturnHandlerSS, Prologue);
        }
        else if (ShaderType == SHADER_TYPE_DOMAIN)
        {
            ProcessDomainShaderArguments(TypeToken, ShaderParams, GlobalVariables, ReturnHandlerSS, Prologue);
        }
        else if (ShaderType == SHADER_TYPE_COMPUTE)
        {
            ProcessComputeShaderArguments(TypeToken, ShaderParams, GlobalVariables, Prologue);
        }
    }
    catch (const std::runtime_error&)
    {
        LOG_ERROR_AND_THROW("Failed to process shader parameters for shader \"", EntryPoint, "\".");
    }
    ReturnHandlerSS << "return;}\n";


    // void main ()
    // ^
    // TypeToken

    // Insert global variables & return handler before the function
    m_Tokens.insert(TypeToken, TokenInfo(TokenType::TextBlock, GlobalVariables.c_str(), TypeToken->Delimiter.c_str()));
    m_Tokens.insert(TypeToken, TokenInfo(TokenType::TextBlock, ReturnHandlerSS.str().c_str(), "\n"));
    TypeToken->Delimiter = "\n";
    auto BodyStartToken  = ArgsListEndToken;
    while (BodyStartToken != m_Tokens.end() && BodyStartToken->Type != TokenType::OpenBrace)
        ++BodyStartToken;
    // void main ()
    // {
    // ^
    VERIFY_PARSER_STATE(BodyStartToken, BodyStartToken != m_Tokens.end(), "Unexpected end of file while looking for the body of shader entry point \"", EntryPoint, "\".");
    auto FirstStatementToken = BodyStartToken;
    ++FirstStatementToken;
    // void main ()
    // {
    //      int a;
    //      ^
    VERIFY_PARSER_STATE(FirstStatementToken, FirstStatementToken != m_Tokens.end(), "Unexpected end of file while looking for the body of shader entry point \"", EntryPoint, "\".");

    // Insert prologue before the first token
    m_Tokens.insert(FirstStatementToken, TokenInfo(TokenType::TextBlock, Prologue.c_str(), "\n"));

    auto BodyEndToken = BodyStartToken;
    if (ShaderType == SHADER_TYPE_VERTEX || ShaderType == SHADER_TYPE_HULL || ShaderType == SHADER_TYPE_DOMAIN || ShaderType == SHADER_TYPE_PIXEL)
    {
        ProcessReturnStatements(BodyEndToken, bIsVoid, EntryPoint, ReturnMacroName);
    }
    else if (ShaderType == SHADER_TYPE_GEOMETRY)
    {
        auto OutStreamParamIt = ShaderParams.begin();
        for (; OutStreamParamIt != ShaderParams.end(); ++OutStreamParamIt)
            if (OutStreamParamIt->GSAttribs.Stream != ShaderParameterInfo::GSAttributes::StreamType::Undefined)
                break;
        VERIFY_PARSER_STATE(FirstStatementToken, OutStreamParamIt != ShaderParams.end(), "Unable to find output stream variable");
        ProcessGSOutStreamOperations(BodyEndToken, OutStreamParamIt->Name, EntryPoint);
    }
}